

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomString::write(DomString *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QString local_40;
  long local_28;
  
  aVar3._4_4_ = in_register_00000034;
  aVar3._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"string";
    local_40.d.size = 6;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar4.m_size = (size_t)local_40.d.ptr;
  QVar4.field_0.m_data = aVar3.m_data;
  QXmlStreamWriter::writeStartElement(QVar4);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_notr == true) {
    pQVar1 = &((this->m_attr_notr).d.d)->super_QArrayData;
    pcVar2 = (this->m_attr_notr).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar6.m_size = (size_t)L"notr";
      QVar6.field_0.m_data = aVar3.m_data;
      QVar15.m_size = (size_t)pcVar2;
      QVar15.field_0.m_data = (void *)0x8000000000000004;
      QXmlStreamWriter::writeAttribute(QVar6,QVar15);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar5.m_size = (size_t)L"notr";
      QVar5.field_0.m_data = aVar3.m_data;
      QVar14.m_size = (size_t)pcVar2;
      QVar14.field_0.m_data = (void *)0x8000000000000004;
      QXmlStreamWriter::writeAttribute(QVar5,QVar14);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_comment == true) {
    pQVar1 = &((this->m_attr_comment).d.d)->super_QArrayData;
    pcVar2 = (this->m_attr_comment).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar8.m_size = (size_t)L"comment";
      QVar8.field_0.m_data = aVar3.m_data;
      QVar17.m_size = (size_t)pcVar2;
      QVar17.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
      QXmlStreamWriter::writeAttribute(QVar8,QVar17);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar7.m_size = (size_t)L"comment";
      QVar7.field_0.m_data = aVar3.m_data;
      QVar16.m_size = (size_t)pcVar2;
      QVar16.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
      QXmlStreamWriter::writeAttribute(QVar7,QVar16);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_extraComment == true) {
    pQVar1 = &((this->m_attr_extraComment).d.d)->super_QArrayData;
    pcVar2 = (this->m_attr_extraComment).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar10.m_size = (size_t)L"extracomment";
      QVar10.field_0.m_data = aVar3.m_data;
      QVar19.m_size = (size_t)pcVar2;
      QVar19.field_0.m_data = (void *)0x800000000000000c;
      QXmlStreamWriter::writeAttribute(QVar10,QVar19);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar9.m_size = (size_t)L"extracomment";
      QVar9.field_0.m_data = aVar3.m_data;
      QVar18.m_size = (size_t)pcVar2;
      QVar18.field_0.m_data = (void *)0x800000000000000c;
      QXmlStreamWriter::writeAttribute(QVar9,QVar18);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_id == true) {
    pQVar1 = &((this->m_attr_id).d.d)->super_QArrayData;
    pcVar2 = (this->m_attr_id).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar12.m_size = (size_t)L"id";
      QVar12.field_0.m_data = aVar3.m_data;
      QVar21.m_size = (size_t)pcVar2;
      QVar21.field_0.m_data = (void *)0x8000000000000002;
      QXmlStreamWriter::writeAttribute(QVar12,QVar21);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar11.m_size = (size_t)L"id";
      QVar11.field_0.m_data = aVar3.m_data;
      QVar20.m_size = (size_t)pcVar2;
      QVar20.field_0.m_data = (void *)0x8000000000000002;
      QXmlStreamWriter::writeAttribute(QVar11,QVar20);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if ((this->m_text).d.size != 0) {
    QVar13.m_size = (size_t)(this->m_text).d.ptr;
    QVar13.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeCharacters(QVar13);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomString::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("string") : tagName.toLower());

    if (hasAttributeNotr())
        writer.writeAttribute(u"notr"_s, attributeNotr());

    if (hasAttributeComment())
        writer.writeAttribute(u"comment"_s, attributeComment());

    if (hasAttributeExtraComment())
        writer.writeAttribute(u"extracomment"_s, attributeExtraComment());

    if (hasAttributeId())
        writer.writeAttribute(u"id"_s, attributeId());

    if (!m_text.isEmpty())
        writer.writeCharacters(m_text);

    writer.writeEndElement();
}